

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linear_algebra.hpp
# Opt level: O2

matrix<trng::GF2,_521UL> *
trng::operator*(matrix<trng::GF2,_521UL> *__return_storage_ptr__,matrix<trng::GF2,_521UL> *a,
               matrix<trng::GF2,_521UL> *b)

{
  ulong uVar1;
  long lVar2;
  size_type j;
  ulong uVar3;
  pointer pGVar4;
  byte bVar5;
  ulong uVar6;
  long lVar7;
  size_type k_end;
  ulong uVar8;
  ulong uVar9;
  size_type j_1;
  ulong uVar10;
  ulong uVar11;
  ulong local_48;
  
  matrix<trng::GF2,_521UL>::matrix(__return_storage_ptr__);
  for (uVar11 = 0; uVar11 < 0x209; uVar11 = uVar11 + 0x20) {
    uVar3 = 0x1e9;
    if (uVar11 < 0x1e9) {
      uVar3 = uVar11;
    }
    uVar6 = uVar11;
    for (lVar7 = 0; uVar1 = uVar6, uVar8 = uVar11, lVar7 != 0x209; lVar7 = lVar7 + 1) {
      for (; uVar8 < uVar3 + 0x20; uVar8 = uVar8 + 1) {
        (__return_storage_ptr__->data).super__Vector_base<trng::GF2,_std::allocator<trng::GF2>_>.
        _M_impl.super__Vector_impl_data._M_start[uVar1].value = '\0';
        uVar1 = uVar1 + 1;
      }
      uVar6 = uVar6 + 0x209;
    }
    local_48 = uVar11;
    for (uVar6 = 0; uVar6 < 0x209; uVar6 = uVar6 + 0x20) {
      uVar1 = 0x1e9;
      if (uVar6 < 0x1e9) {
        uVar1 = uVar6;
      }
      uVar8 = uVar6;
      for (lVar7 = 0; lVar7 != 0x209; lVar7 = lVar7 + 1) {
        uVar9 = local_48;
        for (uVar10 = uVar11; uVar10 < uVar3 + 0x20; uVar10 = uVar10 + 1) {
          pGVar4 = (b->data).super__Vector_base<trng::GF2,_std::allocator<trng::GF2>_>._M_impl.
                   super__Vector_impl_data._M_start + uVar9;
          bVar5 = 0;
          for (lVar2 = 0; uVar6 + lVar2 < uVar1 + 0x20; lVar2 = lVar2 + 1) {
            bVar5 = bVar5 ^ pGVar4->value &
                            (a->data).super__Vector_base<trng::GF2,_std::allocator<trng::GF2>_>.
                            _M_impl.super__Vector_impl_data._M_start[lVar2 + uVar8].value;
            pGVar4 = pGVar4 + 0x209;
          }
          pGVar4 = (__return_storage_ptr__->data).
                   super__Vector_base<trng::GF2,_std::allocator<trng::GF2>_>._M_impl.
                   super__Vector_impl_data._M_start + uVar10 + lVar7 * 0x209;
          pGVar4->value = pGVar4->value ^ bVar5;
          uVar9 = uVar9 + 1;
        }
        uVar8 = uVar8 + 0x209;
      }
      local_48 = local_48 + 0x4120;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

matrix<T, n> operator*(const matrix<T, n> &a, const matrix<T, n> &b) {
    using size_type = typename matrix<T, n>::size_type;
    matrix<T, n> res;
    const size_type step{32};
    for (size_type j0{0}; j0 < n; j0 += step) {
      for (size_type i{0}; i < n; ++i)
        for (size_type j{j0}, j_end{utility::min(n, j0 + step)}; j < j_end; ++j)
          res(i, j) = T{0};
      for (size_type k0{0}; k0 < n; k0 += step) {
        for (size_type i{0}; i < n; ++i)
          for (size_type j{j0}, j_end{utility::min(n, j0 + step)}; j < j_end; ++j) {
            T sum{0};
            for (size_type k{k0}, k_end{utility::min(n, k0 + step)}; k < k_end; ++k)
              sum = sum + a(i, k) * b(k, j);
            res(i, j) = res(i, j) + sum;
          }
      }
    }
    return res;
  }